

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

int coda_type_set_attributes(coda_type *type,coda_type_record *attributes)

{
  coda_type_record *attributes_local;
  coda_type *type_local;
  
  if (type == (coda_type *)0x0) {
    coda_set_error(-100,"type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x3d2);
    type_local._4_4_ = -1;
  }
  else if (attributes == (coda_type_record *)0x0) {
    coda_set_error(-100,"attributes argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x3d7);
    type_local._4_4_ = -1;
  }
  else if (type->attributes == (coda_type_record *)0x0) {
    type->attributes = attributes;
    attributes->retain_count = attributes->retain_count + 1;
    type_local._4_4_ = 0;
  }
  else {
    coda_set_error(-100,"attributes are already set (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,0x3dc);
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

int coda_type_set_attributes(coda_type *type, coda_type_record *attributes)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (attributes == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attributes argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->attributes != NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "attributes are already set (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    type->attributes = attributes;
    attributes->retain_count++;
    return 0;
}